

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
GetId<ot::commissioner::persistent_storage::Registrar,ot::commissioner::persistent_storage::RegistrarId>
          (PersistentStorageJson *this,RegistrarId *aId,Registrar *aRet,string *aArrName)

{
  bool bVar1;
  Status SVar2;
  reference pvVar3;
  reference this_00;
  json *this_01;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  itValue;
  RegistrarId *local_120;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_118;
  undefined1 local_f8 [8];
  iterator local_f0;
  iterator iStack_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  uint local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_b0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_90;
  iterator local_70;
  iterator local_50;
  
  this_01 = &this->mCache;
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_01,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&local_50,pvVar3);
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_01,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_70,pvVar3);
  local_118.m_it.primitive_iterator.m_it = local_50.m_it.primitive_iterator.m_it;
  local_118.m_it.object_iterator._M_node = local_50.m_it.object_iterator._M_node;
  local_118.m_it.array_iterator._M_current = local_50.m_it.array_iterator._M_current;
  local_90.m_it.primitive_iterator.m_it = local_70.m_it.primitive_iterator.m_it;
  local_90.m_it.object_iterator._M_node = local_70.m_it.object_iterator._M_node;
  local_90.m_it.array_iterator._M_current = local_70.m_it.array_iterator._M_current;
  local_118.m_object = local_50.m_object;
  local_90.m_object = local_70.m_object;
  local_120 = aId;
  bVar1 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_118,&local_90);
  if (!bVar1) {
    do {
      local_f8 = (undefined1  [8])local_118.m_object;
      local_e0._M_allocated_capacity = local_118.m_it.primitive_iterator.m_it;
      local_f0._M_node = local_118.m_it.object_iterator._M_node;
      iStack_e8._M_current = local_118.m_it.array_iterator._M_current;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<ot::commissioner::persistent_storage::PersistentStorageJson::GetId<ot::commissioner::persistent_storage::Registrar,ot::commissioner::persistent_storage::RegistrarId>(ot::commissioner::persistent_storage::RegistrarId_const&,ot::commissioner::persistent_storage::Registrar&,std::__cxx11::string)::{lambda(ot::commissioner::persistent_storage::Registrar_const&)#1}>
              ::operator()((_Iter_pred<ot::commissioner::persistent_storage::PersistentStorageJson::GetId<ot::commissioner::persistent_storage::Registrar,ot::commissioner::persistent_storage::RegistrarId>(ot::commissioner::persistent_storage::RegistrarId_const&,ot::commissioner::persistent_storage::Registrar&,std::__cxx11::string)::_lambda(ot::commissioner::persistent_storage::Registrar_const&)_1_>
                            *)&local_120,
                           (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_f8);
      if (bVar1) break;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_118);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==(&local_118,&local_90);
    } while (!bVar1);
  }
  local_b0.m_object = local_118.m_object;
  local_b0.m_it.object_iterator._M_node = local_118.m_it.object_iterator._M_node;
  local_b0.m_it.array_iterator._M_current = local_118.m_it.array_iterator._M_current;
  local_b0.m_it.primitive_iterator.m_it = local_118.m_it.primitive_iterator.m_it;
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_01,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)local_f8,pvVar3);
  bVar1 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_b0,(iterator *)local_f8);
  SVar2 = kNotFound;
  if (!bVar1) {
    this_00 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*(&local_b0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<ot::commissioner::persistent_storage::Registrar,_ot::commissioner::persistent_storage::Registrar,_0>
              ((Registrar *)local_f8,this_00);
    (aRet->mId).mId = local_f8._0_4_;
    std::__cxx11::string::operator=((string *)&aRet->mAddr,(string *)&local_f0);
    aRet->mPort = local_d0;
    local_118.m_object =
         (pointer)(aRet->mDomains).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_118.m_it.object_iterator._M_node =
         (_Base_ptr)
         (aRet->mDomains).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_118.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)(aRet->mDomains).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (aRet->mDomains).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (aRet->mDomains).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (aRet->mDomains).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_c8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_node != &local_e0) {
      operator_delete(local_f0._M_node);
    }
    SVar2 = kSuccess;
  }
  return SVar2;
}

Assistant:

Status GetId(I const &aId, V &aRet, std::string aArrName)
    {
        auto itValue = std::find_if(std::begin(mCache[aArrName]), std::end(mCache[aArrName]),
                                    [&aId](V const &el) { return el.mId.mId == aId.mId; });
        if (itValue == std::end(mCache[aArrName]))
        {
            return Status::kNotFound;
        }

        aRet = *itValue;

        return Status::kSuccess;
    }